

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O1

void * htable_val(htable *ht,htable_iter *i,size_t hash,uintptr_t perfect)

{
  byte bVar1;
  ulong uVar2;
  uintptr_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  bVar1 = (byte)ht->bits;
  uVar2 = ht->common_mask;
  uVar6 = ~ht->perfect_bit & uVar2 & (hash >> (bVar1 & 0x3f) ^ hash);
  puVar3 = ht->table;
  uVar5 = i->off;
  uVar7 = uVar6 | perfect;
  do {
    uVar4 = puVar3[uVar5];
    if (uVar4 != 1) {
      if (uVar4 == 0) {
        return (void *)0x0;
      }
      if ((uVar4 & uVar2) == uVar7) {
        return (void *)(uVar4 & ~uVar2 | ht->common_bits);
      }
    }
    uVar5 = (ulong)((int)uVar5 + 1U & ~(-1 << (bVar1 & 0x1f)));
    i->off = uVar5;
    uVar7 = ~perfect & uVar6;
  } while( true );
}

Assistant:

static void *htable_val(const struct htable *ht,
			struct htable_iter *i, size_t hash, uintptr_t perfect)
{
	uintptr_t h2 = get_hash_ptr_bits(ht, hash) | perfect;

	while (ht->table[i->off]) {
		if (ht->table[i->off] != HTABLE_DELETED) {
			if (get_extra_ptr_bits(ht, ht->table[i->off]) == h2)
				return get_raw_ptr(ht, ht->table[i->off]);
		}
		i->off = (i->off + 1) & ((1 << ht->bits)-1);
		h2 &= ~perfect;
	}
	return NULL;
}